

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O1

index_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::claimCapacity
          (ManyToOneRingBuffer *this,index_t requiredCapacity)

{
  long *plVar1;
  int iVar2;
  AtomicBuffer *pAVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong local_48;
  uint local_40;
  
  uVar6 = this->m_capacity - 1;
  pAVar3 = this->m_buffer;
  iVar2 = this->m_headCachePositionIndex;
  AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
  uVar8 = *(undefined8 *)(pAVar3->m_buffer + iVar2);
  local_48 = (long)requiredCapacity;
  do {
    pAVar3 = this->m_buffer;
    iVar2 = this->m_tailPositionIndex;
    AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
    lVar4 = *(long *)(pAVar3->m_buffer + iVar2);
    uVar9 = (uint)lVar4;
    if ((int)(((int)uVar8 - uVar9) + this->m_capacity) < requiredCapacity) {
      pAVar3 = this->m_buffer;
      iVar2 = this->m_headPositionIndex;
      AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
      uVar8 = *(undefined8 *)(pAVar3->m_buffer + iVar2);
      if (requiredCapacity <= (int)(((int)uVar8 - uVar9) + this->m_capacity)) {
        pAVar3 = this->m_buffer;
        iVar2 = this->m_headCachePositionIndex;
        AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
        *(undefined8 *)(pAVar3->m_buffer + iVar2) = uVar8;
        goto LAB_00135b05;
      }
      bVar5 = false;
    }
    else {
LAB_00135b05:
      local_40 = uVar6 & uVar9;
      uVar9 = this->m_capacity - local_40;
      local_48 = (ulong)uVar9;
      bVar5 = true;
      if ((int)uVar9 < requiredCapacity) {
        if ((int)(uVar6 & (uint)uVar8) < requiredCapacity) {
          pAVar3 = this->m_buffer;
          iVar2 = this->m_headPositionIndex;
          AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
          uVar8 = *(undefined8 *)(pAVar3->m_buffer + iVar2);
          if ((int)(uVar6 & (uint)uVar8) < requiredCapacity) {
            local_48 = 0;
            bVar5 = false;
          }
          else {
            pAVar3 = this->m_buffer;
            iVar2 = this->m_headCachePositionIndex;
            AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
            *(undefined8 *)(pAVar3->m_buffer + iVar2) = uVar8;
            bVar5 = true;
          }
        }
      }
      else {
        local_48 = 0;
      }
    }
    if (!bVar5) {
      return -2;
    }
    pAVar3 = this->m_buffer;
    iVar2 = this->m_tailPositionIndex;
    AtomicBuffer::boundsCheck(pAVar3,iVar2,8);
    plVar1 = (long *)(pAVar3->m_buffer + iVar2);
    LOCK();
    lVar7 = *plVar1;
    if (lVar4 == lVar7) {
      *plVar1 = (long)(int)local_48 + requiredCapacity + lVar4;
      lVar7 = lVar4;
    }
    UNLOCK();
    if (lVar7 == lVar4) {
      if ((int)local_48 != 0) {
        pAVar3 = this->m_buffer;
        AtomicBuffer::boundsCheck(pAVar3,local_40,8);
        *(ulong *)(pAVar3->m_buffer + (int)local_40) = local_48 | 0xffffffff00000000;
        local_40 = 0;
      }
      return local_40;
    }
  } while( true );
}

Assistant:

util::index_t claimCapacity(util::index_t requiredCapacity)
    {
        const util::index_t mask = m_capacity - 1;
        std::int64_t head = m_buffer.getInt64Volatile(m_headCachePositionIndex);

        std::int64_t tail;
        util::index_t tailIndex;
        util::index_t padding;
        do
        {
            tail = m_buffer.getInt64Volatile(m_tailPositionIndex);
            const util::index_t availableCapacity = m_capacity - static_cast<util::index_t>(tail - head);

            if (requiredCapacity > availableCapacity)
            {
                head = m_buffer.getInt64Volatile(m_headPositionIndex);

                if (requiredCapacity > (m_capacity - static_cast<util::index_t>(tail - head)))
                {
                    return INSUFFICIENT_CAPACITY;
                }

                m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
            }

            padding = 0;
            tailIndex = static_cast<util::index_t>(tail & mask);
            const util::index_t toBufferEndLength = m_capacity - tailIndex;

            if (requiredCapacity > toBufferEndLength)
            {
                std::int32_t headIndex = static_cast<std::int32_t>(head & mask);

                if (requiredCapacity > headIndex)
                {
                    head = m_buffer.getInt64Volatile(m_headPositionIndex);
                    headIndex = static_cast<std::int32_t>(head & mask);

                    if (requiredCapacity > headIndex)
                    {
                        return INSUFFICIENT_CAPACITY;
                    }

                    m_buffer.putInt64Ordered(m_headCachePositionIndex, head);
                }

                padding = toBufferEndLength;
            }
        }
        while (!m_buffer.compareAndSetInt64(m_tailPositionIndex, tail, tail + requiredCapacity + padding));

        if (0 != padding)
        {
            m_buffer.putInt64Ordered(
                tailIndex, RecordDescriptor::makeHeader(padding, RecordDescriptor::PADDING_MSG_TYPE_ID));
            tailIndex = 0;
        }

        return tailIndex;
    }